

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O2

_Bool get_table_column(ecs_iter_t *it,int32_t column,int32_t *table_column_out)

{
  int32_t *piVar1;
  uint __line;
  char *__assertion;
  int iVar2;
  
  iVar2 = 0;
  _ecs_assert(column <= it->column_count,2,(char *)0x0,"column <= it->column_count",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0x38);
  if (it->column_count < column) {
    __assertion = "column <= it->column_count";
    __line = 0x38;
LAB_001141a9:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,__line,"_Bool get_table_column(const ecs_iter_t *, int32_t, int32_t *)");
  }
  if (column != 0) {
    _ecs_assert(it->table->columns != (int32_t *)0x0,0xc,(char *)0x0,"it->table->columns != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                ,0x3d);
    piVar1 = it->table->columns;
    if (piVar1 == (int32_t *)0x0) {
      __assertion = "it->table->columns != ((void*)0)";
      __line = 0x3d;
      goto LAB_001141a9;
    }
    iVar2 = piVar1[(long)column + -1];
    if (iVar2 == 0) {
      return false;
    }
  }
  *table_column_out = iVar2;
  return true;
}

Assistant:

static
bool get_table_column(
    const ecs_iter_t *it,
    int32_t column,
    int32_t *table_column_out)
{
    ecs_assert(column <= it->column_count, ECS_INVALID_PARAMETER, NULL);

    int32_t table_column = 0;

    if (column != 0) {
        ecs_assert(it->table->columns != NULL, ECS_INTERNAL_ERROR, NULL);

        table_column = it->table->columns[column - 1];
        if (!table_column) {
            /* column is not set */
            return false;
        }
    }

    *table_column_out = table_column;

    return true;
}